

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *pGVar1;
  l_mem lVar2;
  ulong uVar3;
  GCObject **ppGVar4;
  byte bVar5;
  byte bVar6;
  Udata *u;
  
  while( true ) {
    lVar2 = objsize(o);
    g->GCmarked = g->GCmarked + lVar2;
    bVar6 = o->tt;
    if (bVar6 != 9) break;
    pGVar1 = o[1].next;
    bVar5 = o->marked & 199;
    bVar6 = bVar5 + 0x20;
    if (pGVar1 != (GCObject *)&o[1].tt) {
      bVar6 = bVar5;
    }
    o->marked = bVar6;
    if ((pGVar1->tt & 0x40) == 0) {
      return;
    }
    o = pGVar1->next;
    if ((o->marked & 0x18) == 0) {
      return;
    }
  }
  if (0x26 < bVar6) {
    return;
  }
  uVar3 = (ulong)bVar6;
  if ((0x4000000560U >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x100010UL >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 != 7) {
        return;
      }
      if (*(short *)&o->field_0xa != 0) goto LAB_0010df6e;
      pGVar1 = *(GCObject **)&o[1].tt;
      if ((pGVar1 != (GCObject *)0x0) && ((pGVar1->marked & 0x18) != 0)) {
        reallymarkobject(g,pGVar1);
      }
    }
    o->marked = o->marked & 199 | 0x20;
  }
  else {
LAB_0010df6e:
    ppGVar4 = getgclist(o);
    *ppGVar4 = g->gray;
    g->gray = o;
    o->marked = o->marked & 199;
  }
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  g->GCmarked += objsize(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      set2black(o);  /* nothing to visit */
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (upisopen(uv))
        set2gray(uv);  /* open upvalues are kept gray */
      else
        set2black(uv);  /* closed upvalues are visited here */
      markvalue(g, uv->v.p);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        set2black(u);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);  /* to be visited later */
      break;
    }
    default: lua_assert(0); break;
  }
}